

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

void Gia_ManAreCompress(Gia_ManAre_t *p,Gia_PtrAre_t *pRoot)

{
  int iVar1;
  Gia_PtrAre_t local_2c;
  Gia_PtrAre_t local_28;
  Gia_PtrAre_t iNext;
  Gia_PtrAre_t iCube;
  Gia_PtrAre_t iList;
  Gia_StaAre_t *pCube;
  Gia_PtrAre_t *pRoot_local;
  Gia_ManAre_t *p_local;
  
  local_28 = *pRoot;
  if ((((uint)*pRoot & 0xfffff) == 0) && (((uint)*pRoot >> 0x14 & 0x7ff) == 0)) {
    __assert_fail("pRoot->nItem || pRoot->nPage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                  ,0x3b1,"void Gia_ManAreCompress(Gia_ManAre_t *, Gia_PtrAre_t *)");
  }
  *pRoot = (Gia_PtrAre_t)((uint)*pRoot & 0xfff00000);
  *pRoot = (Gia_PtrAre_t)((uint)*pRoot & 0x800fffff);
  _iCube = Gia_ManAreSta(p,local_28);
  local_2c = _iCube->iNext;
  while (iVar1 = Gia_StaIsGood(p,_iCube), iVar1 != 0) {
    iVar1 = Gia_StaIsUnused(_iCube);
    if (iVar1 == 0) {
      _iCube->iNext = *pRoot;
      *pRoot = local_28;
    }
    local_28 = local_2c;
    _iCube = Gia_ManAreSta(p,local_2c);
    local_2c = _iCube->iNext;
  }
  return;
}

Assistant:

static inline void Gia_ManAreCompress( Gia_ManAre_t * p, Gia_PtrAre_t * pRoot )
{
    Gia_StaAre_t * pCube;
    Gia_PtrAre_t iList = *pRoot;
    Gia_PtrAre_t iCube, iNext;
    assert( pRoot->nItem || pRoot->nPage );
    pRoot->nItem = 0; 
    pRoot->nPage = 0;
    for ( iCube = iList, pCube = Gia_ManAreSta(p, iCube), iNext = pCube->iNext; 
          Gia_StaIsGood(p, pCube); 
          iCube = iNext, pCube = Gia_ManAreSta(p, iCube), iNext = pCube->iNext )
    {
        if ( Gia_StaIsUnused(pCube) )
            continue;
        pCube->iNext = *pRoot;
        *pRoot = iCube;
    }
}